

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathGeneratorAdapterTests::AddingPathToSinkTranslateCloses
          (PathGeneratorAdapterTests *this)

{
  pointer ppVar1;
  uint uVar2;
  pointer ppVar3;
  ulong uVar4;
  mock_path_sink s;
  point reference [4];
  path p;
  point input [2];
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  local_118;
  ulong local_100;
  mock_path_sink local_f8;
  string local_d8;
  point local_b8;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  LocationInfo local_80;
  void *local_58 [3];
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined8 local_28;
  
  local_38._0_4_ = 11.0;
  local_38._4_4_ = 23.0;
  local_38._8_8_ = 0x4040000000000022;
  local_28 = 0x2240e00000;
  std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>::
  vector<agge::tests::mocks::path::point*>
            ((vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>
              *)local_58,(point *)local_38,(point *)&stack0xffffffffffffffe0,
             (allocator_type *)&local_b8);
  local_40 = 0;
  local_f8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  vector(&local_118,
         (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)local_58);
  local_100 = 0;
  if (local_118.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_118.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_100 = 0;
    do {
      ppVar1 = local_118.
               super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               ._M_impl.super__Vector_impl_data._M_start + local_100;
      ppVar3 = local_118.
               super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               ._M_impl.super__Vector_impl_data._M_start + local_100;
      uVar4 = local_100 + 1;
      uVar2 = local_118.
              super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              ._M_impl.super__Vector_impl_data._M_start[local_100].command;
      local_100 = uVar4;
      if (uVar2 == 0) goto LAB_00157149;
      if ((uVar2 & 7) == 2) {
        mock_path_sink::line_to(&local_f8,ppVar1->x,ppVar3->y);
      }
      else if ((uVar2 & 7) == 1) {
        mock_path_sink::move_to(&local_f8,ppVar1->x,ppVar3->y);
      }
      if ((uVar2 & 0x20) != 0) {
        mock_path_sink::close_polygon(&local_f8);
      }
    } while (local_100 <
             (ulong)(((long)local_118.
                            super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555));
  }
  if (local_118.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00157149:
    operator_delete(local_118.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_98 = 2;
  uStack_90 = 0x2000000000;
  local_a8 = 0x2000000000;
  uStack_a0 = 0x40e0000040400000;
  local_b8.x = 11.0;
  local_b8.y = 23.0;
  local_b8.command = 2;
  uStack_ac = 0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_80,&local_d8,0x15d);
  ut::
  are_equal<agge::tests::mocks::path::point,4ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [4])&local_b8,&local_f8.points,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.filename._M_dataplus._M_p != &local_80.filename.field_2) {
    operator_delete(local_80.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8.points.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.points.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58[0] != (void *)0x0) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

test( AddingPathToSinkTranslateCloses )
			{
				// INIT
				mocks::path::point input[] = {
					{ 11.0f, 23.0f, path_command_line_to | path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to | path_flag_close },
				};
				const mocks::path p(input);
				mock_path_sink s;

				// ACT
				add_path(s, p);

				// ASSERT
				mocks::path::point reference[] = {
					{ 11.0f, 23.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
				};

				assert_equal(reference, s.points);
			}